

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParserNsUpdateSax(xmlParserCtxtPtr ctxt,xmlChar *prefix,void *saxData)

{
  int iVar1;
  undefined1 local_38 [4];
  int nsIndex;
  xmlHashedString hprefix;
  void *saxData_local;
  xmlChar *prefix_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (prefix == ctxt->str_xml) {
    ctxt_local._4_4_ = -1;
  }
  else {
    hprefix._0_8_ = prefix;
    hprefix.name = (xmlChar *)saxData;
    if (prefix == (xmlChar *)0x0) {
      local_38 = (undefined1  [4])0x0;
    }
    else {
      local_38 = (undefined1  [4])xmlDictComputeHash(ctxt->dict,prefix);
    }
    iVar1 = xmlParserNsLookup(ctxt,(xmlHashedString *)local_38,(xmlParserNsBucket **)0x0);
    if ((iVar1 == 0x7fffffff) || (iVar1 < ctxt->nsdb->minNsIndex)) {
      ctxt_local._4_4_ = -1;
    }
    else {
      ctxt->nsdb->extra[iVar1].saxData = hprefix.name;
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParserNsUpdateSax(xmlParserCtxtPtr ctxt, const xmlChar *prefix,
                     void *saxData) {
    xmlHashedString hprefix;
    int nsIndex;

    if (prefix == ctxt->str_xml)
        return(-1);

    hprefix.name = prefix;
    if (prefix != NULL)
        hprefix.hashValue = xmlDictComputeHash(ctxt->dict, prefix);
    else
        hprefix.hashValue = 0;
    nsIndex = xmlParserNsLookup(ctxt, &hprefix, NULL);
    if ((nsIndex == INT_MAX) || (nsIndex < ctxt->nsdb->minNsIndex))
        return(-1);

    ctxt->nsdb->extra[nsIndex].saxData = saxData;
    return(0);
}